

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall
caffe::HingeLossParameter::set_norm(HingeLossParameter *this,HingeLossParameter_Norm value)

{
  if (value - HingeLossParameter_Norm_L1 < 2) {
    *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
    this->norm_ = value;
    return;
  }
  __assert_fail("::caffe::HingeLossParameter_Norm_IsValid(value)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/include/caffe/proto/caffe.pb.h"
                ,0x4c44,"void caffe::HingeLossParameter::set_norm(::caffe::HingeLossParameter_Norm)"
               );
}

Assistant:

bool HingeLossParameter_Norm_IsValid(int value) {
  switch (value) {
    case 1:
    case 2:
      return true;
    default:
      return false;
  }
}